

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ctl.c
# Opt level: O1

int gost_control_func(ENGINE *e,int cmd,long i,void *p,_func_void *f)

{
  int iVar1;
  
  if (cmd - 0xccU < 0xfffffffc) {
    return -1;
  }
  iVar1 = gost_set_default_param(cmd + -200,(char *)p);
  return iVar1;
}

Assistant:

int gost_control_func(ENGINE *e, int cmd, long i, void *p, void (*f) (void))
{
    int param = cmd - ENGINE_CMD_BASE;
    int ret = 0;
    if (param < 0 || param > GOST_PARAM_MAX) {
        return -1;
    }
    ret = gost_set_default_param(param, p);
    return ret;
}